

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>::erase
          (Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
           *this,Bucket bucket)

{
  Entry *args;
  byte bVar1;
  Span<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_> *pSVar2;
  QHashMultiReturnType<unsigned_int,_int,_int> QVar3;
  Span<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_> *pSVar4;
  Span<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_> *pSVar5;
  Span<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_> *this_00;
  Span<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_> *fromSpan
  ;
  ulong uVar6;
  size_t fromIndex;
  size_t to;
  long in_FS_OFFSET;
  uint local_40;
  uint local_3c;
  long local_38;
  
  fromIndex = bucket.index;
  fromSpan = bucket.span;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  fromSpan->entries[bVar1].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar1;
  this->size = this->size - 1;
  this_00 = fromSpan;
  to = fromIndex;
  do {
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      fromSpan = fromSpan + 1;
      if (((long)fromSpan - (long)this->spans >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
          == 0) {
        fromSpan = this->spans;
      }
      fromIndex = 0;
    }
    bVar1 = fromSpan->offsets[fromIndex];
    if ((ulong)bVar1 != 0xff) {
      args = fromSpan->entries + bVar1;
      local_3c = *(uint *)((args->storage).data + 4);
      local_40 = *(uint *)((args->storage).data + 8);
      QVar3 = qHashMulti<unsigned_int,int,int>
                        (this->seed,(uint *)args,(int *)&local_3c,(int *)&local_40);
      pSVar2 = this->spans;
      uVar6 = this->numBuckets - 1 & QVar3;
      pSVar4 = pSVar2 + (uVar6 >> 7);
      uVar6 = (ulong)((uint)uVar6 & 0x7f);
      if (uVar6 != fromIndex || pSVar4 != fromSpan) {
        do {
          if ((pSVar4 == this_00) && (uVar6 == to)) {
            if (fromSpan == this_00) {
              this_00->offsets[to] = this_00->offsets[fromIndex];
              this_00->offsets[fromIndex] = 0xff;
              this_00 = fromSpan;
              to = fromIndex;
            }
            else {
              Span<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
              ::moveFromSpan(this_00,fromSpan,fromIndex,to);
              this_00 = fromSpan;
              to = fromIndex;
            }
            break;
          }
          uVar6 = uVar6 + 1;
          if (uVar6 == 0x80) {
            pSVar5 = pSVar4 + 1;
            pSVar4 = pSVar2;
            if (((long)pSVar5 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
                != 0) {
              pSVar4 = pSVar5;
            }
            uVar6 = 0;
          }
        } while ((pSVar4 != fromSpan) || (uVar6 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }